

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute_mst.c
# Opt level: O2

void sift_down(int i)

{
  node_pair nVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int e2;
  
  iVar2 = heap_size;
  while( true ) {
    iVar4 = i * 2;
    if (iVar2 < iVar4) {
      return;
    }
    e2 = iVar2;
    if (iVar4 != iVar2) {
      e2 = i * 2 + 1;
      iVar3 = in_heap_order(iVar4,e2);
      if (iVar3 != 0) {
        e2 = iVar4;
      }
    }
    iVar4 = in_heap_order(e2,i);
    if (iVar4 == 0) break;
    nVar1 = heap[e2];
    heap[e2] = heap[i];
    heap[i] = nVar1;
    i = e2;
  }
  return;
}

Assistant:

void sift_down(int i)
{
  int left, right, j;
  node_pair tmp;

  left = i*2;
  right = left+1;

  while (left <= heap_size) {
    if (left == heap_size || in_heap_order(left, right)) {
      j = left;
    } else {
      j = right;
    }
    if (in_heap_order(j, i)) {
      tmp = heap[j];
      heap[j] = heap[i];
      heap[i] = tmp;
      i = j;
      left = i*2;
      right = left+1;
    } else {
      break;
    }
  }
}